

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionEvaluationFile.cxx
# Opt level: O0

void __thiscall
cmGeneratorExpressionEvaluationFile::Generate
          (cmGeneratorExpressionEvaluationFile *this,cmLocalGenerator *lg)

{
  size_t *this_00;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  cmCompiledGeneratorExpression *pcVar5;
  auto_ptr_ref<cmCompiledGeneratorExpression> r;
  cmMakefile *pcVar6;
  reference config;
  reference lang;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5f0;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5e8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5e0;
  const_iterator li;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5d0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_5c8;
  const_iterator le;
  cmGlobalGenerator *gg;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  enabledLanguages;
  value_type local_598;
  string local_578;
  undefined1 local_558 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  allConfigs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  outputFiles;
  auto_ptr<cmCompiledGeneratorExpression> local_500;
  auto_ptr<cmCompiledGeneratorExpression> inputExpression;
  cmGeneratorExpression contentGE;
  cmListFileBacktrace lfbt;
  undefined1 local_498 [8];
  string sep;
  string line;
  string local_450;
  undefined1 local_430 [8];
  ostringstream e;
  long local_2b8;
  ifstream fin;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  string inputFileName;
  string local_40 [8];
  string inputContent;
  mode_t perm;
  cmLocalGenerator *lg_local;
  cmGeneratorExpressionEvaluationFile *this_local;
  
  inputContent.field_2._12_4_ = 0;
  std::__cxx11::string::string(local_40);
  if ((this->InputIsContent & 1U) == 0) {
    std::__cxx11::string::string((string *)local_70,(string *)this);
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)local_70);
    if (bVar2) {
      cmsys::SystemTools::CollapseFullPath(&local_90,(string *)local_70);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_90);
      std::__cxx11::string::~string((string *)&local_90);
    }
    else {
      FixRelativePath(&local_b0,this,(string *)local_70,PathForInput,lg);
      std::__cxx11::string::operator=((string *)local_70,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
    }
    pcVar6 = cmLocalGenerator::GetMakefile(lg);
    cmMakefile::AddCMakeDependFile(pcVar6,(string *)local_70);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    cmsys::SystemTools::GetPermissions(pcVar3,(mode_t *)(inputContent.field_2._M_local_buf + 0xc));
    pcVar3 = (char *)std::__cxx11::string::c_str();
    std::ifstream::ifstream(&local_2b8,pcVar3,_S_in);
    bVar1 = std::ios::operator!((ios *)((long)&local_2b8 + *(long *)(local_2b8 + -0x18)));
    if ((bVar1 & 1) == 0) {
      std::__cxx11::string::string((string *)(sep.field_2._M_local_buf + 8));
      std::__cxx11::string::string((string *)local_498);
      while (bVar2 = cmsys::SystemTools::GetLineFromStream
                               ((istream *)&local_2b8,(string *)((long)&sep.field_2 + 8),(bool *)0x0
                                ,-1), bVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &lfbt.Cur,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_498,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&sep.field_2 + 8));
        std::__cxx11::string::operator+=(local_40,(string *)&lfbt.Cur);
        std::__cxx11::string::~string((string *)&lfbt.Cur);
        std::__cxx11::string::operator=((string *)local_498,"\n");
      }
      std::__cxx11::string::operator+=(local_40,(string *)local_498);
      std::__cxx11::string::~string((string *)local_498);
      std::__cxx11::string::~string((string *)(sep.field_2._M_local_buf + 8));
      bVar2 = false;
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_430);
      poVar4 = std::operator<<((ostream *)local_430,"Evaluation file \"");
      poVar4 = std::operator<<(poVar4,(string *)local_70);
      std::operator<<(poVar4,"\" cannot be read.");
      std::__cxx11::ostringstream::str();
      cmLocalGenerator::IssueMessage(lg,FATAL_ERROR,&local_450);
      std::__cxx11::string::~string((string *)&local_450);
      bVar2 = true;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_430);
    }
    std::ifstream::~ifstream(&local_2b8);
    std::__cxx11::string::~string((string *)local_70);
    if (bVar2) goto LAB_006e96d0;
  }
  else {
    std::__cxx11::string::operator=(local_40,(string *)this);
  }
  pcVar5 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->(&this->OutputFileExpr);
  cmCompiledGeneratorExpression::GetBacktrace
            ((cmListFileBacktrace *)&contentGE.Backtrace.Cur,pcVar5);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)&inputExpression,
             (cmListFileBacktrace *)&contentGE.Backtrace.Cur);
  cmGeneratorExpression::Parse
            ((cmGeneratorExpression *)&outputFiles._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)&inputExpression);
  this_00 = &outputFiles._M_t._M_impl.super__Rb_tree_header._M_node_count;
  r = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)this_00);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr(&local_500,r);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)this_00);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)&allConfigs.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_558);
  pcVar6 = cmLocalGenerator::GetMakefile(lg);
  cmMakefile::GetConfigurations
            (&local_578,pcVar6,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_558,true);
  std::__cxx11::string::~string((string *)&local_578);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_558);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_598,"",
               (allocator *)
               ((long)&enabledLanguages.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_558,&local_598);
    std::__cxx11::string::~string((string *)&local_598);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&enabledLanguages.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&gg);
  le._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       cmLocalGenerator::GetGlobalGenerator(lg);
  cmGlobalGenerator::GetEnabledLanguages
            ((cmGlobalGenerator *)le._M_current,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&gg);
  local_5d0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gg);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_5c8,&local_5d0);
  while( true ) {
    li._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&gg);
    bVar2 = __gnu_cxx::operator!=
                      (&local_5c8,
                       (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&li);
    if (!bVar2) break;
    local_5e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_558);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_5e0,&local_5e8);
    while( true ) {
      local_5f0._M_current =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_558);
      bVar2 = __gnu_cxx::operator!=(&local_5e0,&local_5f0);
      if (!bVar2) break;
      config = __gnu_cxx::
               __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&local_5e0);
      lang = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_5c8);
      pcVar5 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::get(&local_500);
      Generate(this,lg,config,lang,pcVar5,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&allConfigs.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage,inputContent.field_2._12_4_);
      bVar2 = cmSystemTools::GetFatalErrorOccured();
      if (bVar2) goto LAB_006e9688;
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_5e0);
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_5c8);
  }
LAB_006e9688:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&gg);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_558);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)&allConfigs.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_500);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)&inputExpression);
  cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&contentGE.Backtrace.Cur);
LAB_006e96d0:
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void cmGeneratorExpressionEvaluationFile::Generate(cmLocalGenerator* lg)
{
  mode_t perm = 0;
  std::string inputContent;
  if (this->InputIsContent) {
    inputContent = this->Input;
  } else {
    std::string inputFileName = this->Input;
    if (cmSystemTools::FileIsFullPath(inputFileName)) {
      inputFileName = cmSystemTools::CollapseFullPath(inputFileName);
    } else {
      inputFileName = this->FixRelativePath(inputFileName, PathForInput, lg);
    }
    lg->GetMakefile()->AddCMakeDependFile(inputFileName);
    cmSystemTools::GetPermissions(inputFileName.c_str(), perm);
    cmsys::ifstream fin(inputFileName.c_str());
    if (!fin) {
      std::ostringstream e;
      e << "Evaluation file \"" << inputFileName << "\" cannot be read.";
      lg->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
    }

    std::string line;
    std::string sep;
    while (cmSystemTools::GetLineFromStream(fin, line)) {
      inputContent += sep + line;
      sep = "\n";
    }
    inputContent += sep;
  }

  cmListFileBacktrace lfbt = this->OutputFileExpr->GetBacktrace();
  cmGeneratorExpression contentGE(lfbt);
  CM_AUTO_PTR<cmCompiledGeneratorExpression> inputExpression =
    contentGE.Parse(inputContent);

  std::map<std::string, std::string> outputFiles;

  std::vector<std::string> allConfigs;
  lg->GetMakefile()->GetConfigurations(allConfigs);

  if (allConfigs.empty()) {
    allConfigs.push_back("");
  }

  std::vector<std::string> enabledLanguages;
  cmGlobalGenerator* gg = lg->GetGlobalGenerator();
  gg->GetEnabledLanguages(enabledLanguages);

  for (std::vector<std::string>::const_iterator le = enabledLanguages.begin();
       le != enabledLanguages.end(); ++le) {
    for (std::vector<std::string>::const_iterator li = allConfigs.begin();
         li != allConfigs.end(); ++li) {
      this->Generate(lg, *li, *le, inputExpression.get(), outputFiles, perm);
      if (cmSystemTools::GetFatalErrorOccured()) {
        return;
      }
    }
  }
}